

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

string * gbt_vb_name_abi_cxx11_(string *__return_storage_ptr__,DeploymentPos pos)

{
  undefined6 in_register_00000032;
  ulong uVar1;
  long in_FS_OFFSET;
  allocator<char> local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (ulong)(uint)((int)CONCAT62(in_register_00000032,pos) << 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             *(char **)((long)&VersionBitsDeploymentInfo[0].name + uVar1),&local_21);
  if ((&VersionBitsDeploymentInfo[0].gbt_force)[uVar1] == false) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,(__const_iterator)(__return_storage_ptr__->_M_dataplus)._M_p,
               '!');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string gbt_vb_name(const Consensus::DeploymentPos pos) {
    const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
    std::string s = vbinfo.name;
    if (!vbinfo.gbt_force) {
        s.insert(s.begin(), '!');
    }
    return s;
}